

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretTime.c
# Opt level: O2

int Abc_FlowRetime_RefineConstraints(void)

{
  int *piVar1;
  Abc_Ntk_t *pNtk;
  uint uVar2;
  uint uVar3;
  Abc_Obj_t *pAVar4;
  int iVar5;
  
  pNtk = pManMR->pNtk;
  if (pManMR->fVerbose == 0) {
    pManMR->constraintMask = 0x90;
  }
  else {
    printf("\t\tsubiter %d : constraints = {cons, exact} = %d, %d\n",
           (ulong)(uint)pManMR->subIteration,(ulong)(uint)pManMR->nConservConstraints,
           (ulong)(uint)pManMR->nExactConstraints);
    piVar1 = &pManMR->fVerbose;
    pManMR->constraintMask = 0x90;
    if (*piVar1 != 0) {
      printf("\t\trefinement: over ");
    }
  }
  fflush(_stdout);
  Abc_FlowRetime_PushFlows(pNtk,0);
  if (pManMR->fVerbose != 0) {
    printf("= %d ");
  }
  if (pManMR->fIsForward == 0) {
    for (iVar5 = 0; iVar5 < pNtk->vObjs->nSize; iVar5 = iVar5 + 1) {
      pAVar4 = Abc_NtkObj(pNtk,iVar5);
      if ((pAVar4 != (Abc_Obj_t *)0x0) &&
         ((undefined1  [24])
          ((undefined1  [24])pManMR->pDataArray[(uint)pAVar4->Id] & (undefined1  [24])0x1) ==
          (undefined1  [24])0x0)) {
        pAVar4->field_0x14 = pAVar4->field_0x14 | 0x40;
      }
    }
  }
  else {
    for (iVar5 = 0; iVar5 < pNtk->vObjs->nSize; iVar5 = iVar5 + 1) {
      pAVar4 = Abc_NtkObj(pNtk,iVar5);
      if ((pAVar4 != (Abc_Obj_t *)0x0) &&
         ((undefined1  [24])
          ((undefined1  [24])pManMR->pDataArray[(uint)pAVar4->Id] & (undefined1  [24])0x2) ==
          (undefined1  [24])0x0)) {
        pAVar4->field_0x14 = pAVar4->field_0x14 | 0x40;
      }
    }
  }
  if (pManMR->fConservTimingOnly == 0) {
    pManMR->constraintMask = 0x10;
    Abc_FlowRetime_ClearFlows(0);
    if (pManMR->fVerbose != 0) {
      printf("under = ");
    }
    fflush(_stdout);
    uVar2 = Abc_FlowRetime_PushFlows(pNtk,0);
    if (pManMR->fVerbose != 0) {
      printf("%d refined nodes = ",(ulong)uVar2);
    }
    fflush(_stdout);
    if (pManMR->fIsForward == 0) {
      uVar2 = 0;
      for (iVar5 = 0; iVar5 < pNtk->vObjs->nSize; iVar5 = iVar5 + 1) {
        pAVar4 = Abc_NtkObj(pNtk,iVar5);
        if (pAVar4 != (Abc_Obj_t *)0x0) {
          uVar3 = *(uint *)&pAVar4->field_0x14;
          if ((((uVar3 & 0x40) != 0) &&
              ((*(ushort *)(pManMR->pDataArray + (uint)pAVar4->Id) & 1) != 0)) &&
             ((int)uVar2 < 99999 && (char)*(ushort *)(pManMR->pDataArray + (uint)pAVar4->Id) < '\0')
             ) {
            uVar2 = uVar2 + 1;
            Abc_FlowRetime_ConstrainExact(pAVar4);
            uVar3 = *(uint *)&pAVar4->field_0x14;
          }
          *(uint *)&pAVar4->field_0x14 = uVar3 & 0xffffffbf;
        }
      }
    }
    else {
      uVar2 = 0;
      for (iVar5 = 0; iVar5 < pNtk->vObjs->nSize; iVar5 = iVar5 + 1) {
        pAVar4 = Abc_NtkObj(pNtk,iVar5);
        if (pAVar4 != (Abc_Obj_t *)0x0) {
          uVar3 = *(uint *)&pAVar4->field_0x14;
          if ((((uVar3 & 0x40) != 0) &&
              ((*(ushort *)(pManMR->pDataArray + (uint)pAVar4->Id) & 2) != 0)) &&
             ((int)uVar2 < 99999 && (char)*(ushort *)(pManMR->pDataArray + (uint)pAVar4->Id) < '\0')
             ) {
            uVar2 = uVar2 + 1;
            Abc_FlowRetime_ConstrainExact(pAVar4);
            uVar3 = *(uint *)&pAVar4->field_0x14;
          }
          *(uint *)&pAVar4->field_0x14 = uVar3 & 0xffffffbf;
        }
      }
    }
    if (pManMR->fVerbose != 0) {
      printf("%d\n",(ulong)uVar2);
    }
    uVar2 = (uint)(0 < (int)uVar2);
  }
  else {
    uVar2 = 0;
    if (pManMR->fVerbose != 0) {
      puts(" done");
    }
  }
  return uVar2;
}

Assistant:

int Abc_FlowRetime_RefineConstraints( ) {
  Abc_Ntk_t *pNtk = pManMR->pNtk;
  int i, flow, count = 0;
  Abc_Obj_t *pObj;
  int maxTighten = 99999;

  vprintf("\t\tsubiter %d : constraints = {cons, exact} = %d, %d\n", 
         pManMR->subIteration, pManMR->nConservConstraints, pManMR->nExactConstraints);

  // 1. overconstrained
  pManMR->constraintMask = BLOCK | CONSERVATIVE;
  vprintf("\t\trefinement: over ");
  fflush(stdout);
  flow = Abc_FlowRetime_PushFlows( pNtk, 0 );
  vprintf("= %d ", flow);

  // remember nodes
  if (pManMR->fIsForward) {
    Abc_NtkForEachObj( pNtk, pObj, i )
      if (!FTEST(pObj, VISITED_R))
        pObj->fMarkC = 1;
  } else {
    Abc_NtkForEachObj( pNtk, pObj, i )
      if (!FTEST(pObj, VISITED_E))
        pObj->fMarkC = 1;
  }

  if (pManMR->fConservTimingOnly) {
    vprintf(" done\n");
    return 0;
  }

  // 2. underconstrained
  pManMR->constraintMask = BLOCK;
  Abc_FlowRetime_ClearFlows( 0 );
  vprintf("under = ");
  fflush(stdout);
  flow = Abc_FlowRetime_PushFlows( pNtk, 0 );
  vprintf("%d refined nodes = ", flow);
  fflush(stdout);

  // find area-limiting constraints
  if (pManMR->fIsForward) {
    Abc_NtkForEachObj( pNtk, pObj, i ) {
      if (pObj->fMarkC &&
          FTEST(pObj, VISITED_R) &&
          FTEST(pObj, CONSERVATIVE) && 
          count < maxTighten) {
        count++;
        Abc_FlowRetime_ConstrainExact( pObj );
      }
      pObj->fMarkC = 0;
    }
  } else {
    Abc_NtkForEachObj( pNtk, pObj, i ) {
      if (pObj->fMarkC &&
          FTEST(pObj, VISITED_E) &&
          FTEST(pObj, CONSERVATIVE) &&
          count < maxTighten) {
        count++;
        Abc_FlowRetime_ConstrainExact( pObj );
      }
      pObj->fMarkC = 0;
    }
  }
  
  vprintf("%d\n", count);
  
  return (count > 0);
}